

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_simple_elements
                 (lysp_yin_ctx *ctx,ly_stmt parent_stmt,char ***values,yin_argument arg_type,
                 yang_arg arg_val_type,lysp_ext_instance **exts)

{
  char *local_88;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *p__;
  yin_subelement subelems [1];
  char *local_48;
  uint64_t index;
  char **value;
  lysp_ext_instance **exts_local;
  yang_arg arg_val_type_local;
  yin_argument arg_type_local;
  char ***values_local;
  lysp_yin_ctx *plStack_18;
  ly_stmt parent_stmt_local;
  lysp_yin_ctx *ctx_local;
  
  if (*values == (char **)0x0) {
    local_88 = (char *)0x0;
  }
  else {
    local_88 = (*values)[-1];
  }
  local_48 = local_88;
  p__._0_4_ = 0xf0000;
  subelems[0]._0_8_ = &local_48;
  subelems[0].dest._0_2_ = 0;
  value = (char **)exts;
  exts_local._0_4_ = arg_val_type;
  exts_local._4_4_ = arg_type;
  _arg_val_type_local = values;
  values_local._4_4_ = parent_stmt;
  plStack_18 = ctx;
  if (*values == (char **)0x0) {
    _ret___1 = (undefined8 *)malloc(0x10);
    if (_ret___1 == (undefined8 *)0x0) {
      ly_log(plStack_18->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_simple_elements");
      return LY_EMEM;
    }
    *_ret___1 = 1;
  }
  else {
    (*values)[-1] = (*values)[-1] + 1;
    _ret___1 = (undefined8 *)realloc(*values + -1,(long)(*values)[-1] * 8 + 8);
    if (_ret___1 == (undefined8 *)0x0) {
      (*_arg_val_type_local)[-1] = (*_arg_val_type_local)[-1] + -1;
      ly_log(plStack_18->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "yin_parse_simple_elements");
      return LY_EMEM;
    }
  }
  *_arg_val_type_local = (char **)(_ret___1 + 1);
  index = (uint64_t)(*_arg_val_type_local + (long)((*_arg_val_type_local)[-1] + -1));
  memset((void *)index,0,8);
  ctx_local._4_4_ = lyxml_ctx_next(plStack_18->xmlctx);
  if (((ctx_local._4_4_ == LY_SUCCESS) &&
      (ctx_local._4_4_ =
            yin_parse_attribute(plStack_18,exts_local._4_4_,(char **)index,(yang_arg)exts_local,
                                values_local._4_4_), ctx_local._4_4_ == LY_SUCCESS)) &&
     (ctx_local._4_4_ =
           yin_parse_content(plStack_18,(yin_subelement *)&p__,1,*_arg_val_type_local,
                             values_local._4_4_,(char **)0x0,(lysp_ext_instance **)value),
     ctx_local._4_4_ == LY_SUCCESS)) {
    ctx_local._4_4_ = LY_SUCCESS;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_simple_elements(struct lysp_yin_ctx *ctx, enum ly_stmt parent_stmt, const char ***values,
        enum yin_argument arg_type, enum yang_arg arg_val_type, struct lysp_ext_instance **exts)
{
    const char **value;
    LY_ARRAY_COUNT_TYPE index = LY_ARRAY_COUNT(*values);
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, &index, 0}
    };

    LY_ARRAY_NEW_RET(ctx->xmlctx->ctx, *values, value, LY_EMEM);

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, arg_type, value, arg_val_type, parent_stmt));

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), *values, parent_stmt, NULL, exts));

    return LY_SUCCESS;
}